

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O3

ScopeCtx *
wasm::IRBuilder::ScopeCtx::makeCatchAll(ScopeCtx *__return_storage_ptr__,ScopeCtx *scope,Try *tryy)

{
  pointer ppEVar1;
  pointer puVar2;
  pointer pNVar3;
  size_t sVar4;
  undefined7 uVar5;
  long lVar6;
  ScopeCtx *pSVar7;
  ScopeCtx *pSVar8;
  pointer ppEVar9;
  byte bVar10;
  CatchAllScope local_38;
  
  bVar10 = 0;
  local_38.tryy = tryy;
  local_38.originalLabel = getOriginalLabel(scope);
  std::
  variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
  ::operator=((variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
               *)scope,&local_38);
  ppEVar1 = (scope->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar9 = (scope->exprStack).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar9 != ppEVar1) {
    (scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppEVar1;
    ppEVar9 = ppEVar1;
  }
  scope->unreachable = false;
  (scope->inputType).id = 0;
  scope->inputLocal = 0xffffffff;
  pSVar7 = scope;
  pSVar8 = __return_storage_ptr__;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)
     &(pSVar8->scope).
      super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
         = *(undefined8 *)
            &(pSVar7->scope).
             super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             .
             super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             .
             super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             .
             super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             .
             super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             .
             super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
    ;
    pSVar7 = (ScopeCtx *)((long)pSVar7 + (ulong)bVar10 * -0x10 + 8);
    pSVar8 = (ScopeCtx *)((long)pSVar8 + (ulong)bVar10 * -0x10 + 8);
  }
  __return_storage_ptr__->inputLocal = 0xffffffff;
  puVar2 = (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->outputLocals).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->outputLocals).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar2;
  (__return_storage_ptr__->outputLocals).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (scope->outputLocals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar3 = (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
  ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  (__return_storage_ptr__->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (scope->outputLabels).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->exprStack).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppEVar1;
  (__return_storage_ptr__->exprStack).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppEVar9;
  (__return_storage_ptr__->exprStack).
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (scope->exprStack).
       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (scope->exprStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = *(undefined7 *)&scope->field_0xa1;
  sVar4 = scope->startPos;
  __return_storage_ptr__->unreachable = scope->unreachable;
  *(undefined7 *)&__return_storage_ptr__->field_0xa1 = uVar5;
  __return_storage_ptr__->startPos = sVar4;
  return __return_storage_ptr__;
}

Assistant:

static ScopeCtx makeCatchAll(ScopeCtx&& scope, Try* tryy) {
      scope.scope = CatchAllScope{tryy, scope.getOriginalLabel()};
      scope.resetForDelimiter(/*keepInput=*/false);
      return scope;
    }